

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw.cpp
# Opt level: O0

fixed_t tmvline1_add(void)

{
  int iVar1;
  lighttable_t *plVar2;
  fixed_t fVar3;
  DWORD *pDVar4;
  DWORD *pDVar5;
  BYTE *pBVar6;
  int iVar7;
  uint uVar8;
  DWORD bg;
  DWORD fg;
  BYTE pix;
  DWORD *bg2rgb;
  DWORD *fg2rgb;
  int pitch;
  int bits;
  BYTE *dest;
  BYTE *source;
  int count;
  BYTE *colormap;
  DWORD frac;
  DWORD fracstep;
  
  iVar7 = tmvlinebits;
  pBVar6 = dc_source;
  pDVar5 = dc_destblend;
  pDVar4 = dc_srcblend;
  fVar3 = dc_iscale;
  plVar2 = dc_colormap;
  iVar1 = dc_pitch;
  colormap._0_4_ = dc_texturefrac;
  source._4_4_ = dc_count;
  _pitch = dc_dest;
  do {
    if (pBVar6[(uint)colormap >> ((byte)iVar7 & 0x1f)] != 0) {
      uVar8 = pDVar4[plVar2[pBVar6[(uint)colormap >> ((byte)iVar7 & 0x1f)]]] + pDVar5[*_pitch] |
              0x1f07c1f;
      *_pitch = RGB32k.All[uVar8 & uVar8 >> 0xf];
    }
    colormap._0_4_ = fVar3 + (uint)colormap;
    _pitch = _pitch + iVar1;
    source._4_4_ = source._4_4_ + -1;
  } while (source._4_4_ != 0);
  return (uint)colormap;
}

Assistant:

fixed_t tmvline1_add ()
{
	DWORD fracstep = dc_iscale;
	DWORD frac = dc_texturefrac;
	BYTE *colormap = dc_colormap;
	int count = dc_count;
	const BYTE *source = dc_source;
	BYTE *dest = dc_dest;
	int bits = tmvlinebits;
	int pitch = dc_pitch;

	DWORD *fg2rgb = dc_srcblend;
	DWORD *bg2rgb = dc_destblend;

	do
	{
		BYTE pix = source[frac>>bits];
		if (pix != 0)
		{
			DWORD fg = fg2rgb[colormap[pix]];
			DWORD bg = bg2rgb[*dest];
			fg = (fg+bg) | 0x1f07c1f;
			*dest = RGB32k.All[fg & (fg>>15)];
		}
		frac += fracstep;
		dest += pitch;
	} while (--count);

	return frac;
}